

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_print.c
# Opt level: O0

int ASN1_UNIVERSALSTRING_to_string(ASN1_UNIVERSALSTRING *s)

{
  int iVar1;
  uchar *p;
  int i;
  uchar *local_20;
  int local_14;
  int local_4;
  
  if (s->type == 0x1c) {
    if (s->length % 4 == 0) {
      local_20 = s->data;
      local_14 = 0;
      for (; (((local_14 < s->length && (*local_20 == '\0')) && (local_20[1] == '\0')) &&
             (local_20[2] == '\0')); local_20 = local_20 + 4) {
        local_14 = local_14 + 4;
      }
      if (local_14 < s->length) {
        local_4 = 0;
      }
      else {
        local_20 = s->data;
        for (local_14 = 3; local_14 < s->length; local_14 = local_14 + 4) {
          *local_20 = s->data[local_14];
          local_20 = local_20 + 1;
        }
        *local_20 = '\0';
        s->length = s->length / 4;
        iVar1 = ASN1_PRINTABLE_type(s->data,s->length);
        s->type = iVar1;
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ASN1_UNIVERSALSTRING_to_string(ASN1_UNIVERSALSTRING *s)
{
    int i;
    unsigned char *p;

    if (s->type != V_ASN1_UNIVERSALSTRING)
        return 0;
    if ((s->length % 4) != 0)
        return 0;
    p = s->data;
    for (i = 0; i < s->length; i += 4) {
        if ((p[0] != '\0') || (p[1] != '\0') || (p[2] != '\0'))
            break;
        else
            p += 4;
    }
    if (i < s->length)
        return 0;
    p = s->data;
    for (i = 3; i < s->length; i += 4) {
        *(p++) = s->data[i];
    }
    *(p) = '\0';
    s->length /= 4;
    s->type = ASN1_PRINTABLE_type(s->data, s->length);
    return 1;
}